

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O2

bool_t rngCPUIDIsManufId(u32 *info,char *id)

{
  bool_t bVar1;
  uint uVar2;
  
  bVar1 = memEq(info + 1,id,4);
  uVar2 = 0;
  if (bVar1 != 0) {
    bVar1 = memEq(info + 3,id + 4,4);
    if (bVar1 != 0) {
      bVar1 = memEq(info + 2,id + 8,4);
      uVar2 = (uint)(bVar1 != 0);
    }
  }
  return uVar2;
}

Assistant:

static bool_t rngCPUIDIsManufId(const u32 info[4], const char id[12 + 1])
{
	ASSERT(strIsValid(id));
	ASSERT(strLen(id) == 12);
	return memEq(info + 1, id + 0, 4) &&
		memEq(info + 3, id + 4, 4) &&
		memEq(info + 2, id + 8, 4);
}